

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

void __thiscall
capnp::anon_unknown_1::CppTypeName::addMemberTemplate
          (CppTypeName *this,StringPtr innerName,
          Array<capnp::(anonymous_namespace)::CppTypeName> *params)

{
  undefined1 uVar1;
  size_t count;
  CppTypeName *pCVar2;
  CppTypeName *value;
  StringPtr delim;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 uVar3;
  ArrayBuilder<kj::StringTree> builder;
  undefined1 local_140 [8];
  StringPtr innerName_local;
  Array<kj::StringTree> local_128;
  StringTree local_110;
  StringTree local_d8;
  StringTree local_a0;
  StringTree local_68;
  
  innerName_local.content.size_ = innerName.content.size_;
  innerName_local.content.ptr = innerName.content.ptr;
  uVar1 = this->isArgDependent;
  this->needsTypename = (bool)uVar1;
  uVar3 = true;
  if (this->hasDisambiguatedTemplate_ == false) {
    uVar3 = uVar1;
  }
  local_140 = (undefined1  [8])0x23ffac;
  if ((bool)uVar1 != false) {
    local_140 = (undefined1  [8])0x23ffaf;
  }
  this->hasDisambiguatedTemplate_ = (bool)uVar3;
  uVar3 = 0x3c;
  count = params->size_;
  builder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(count);
  builder.endPtr = builder.ptr + count;
  builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pCVar2 = params->ptr;
  builder.pos = builder.ptr;
  for (value = pCVar2; value != pCVar2 + params->size_; value = value + 1) {
    if (value->isArgDependent == true) {
      this->isArgDependent = true;
    }
    if (value->hasInterfaces_ == true) {
      this->hasInterfaces_ = true;
    }
    if (value->hasDisambiguatedTemplate_ == true) {
      this->hasDisambiguatedTemplate_ = true;
    }
    kj::_::toStringTreeOrCharSequence<capnp::(anonymous_namespace)::CppTypeName>(&local_110,value);
    local_d8.text.content.ptr = local_110.text.content.ptr;
    local_d8.text.content.size_ = local_110.text.content.size_;
    local_110.text.content.ptr = (char *)0x0;
    local_110.text.content.size_ = 0;
    local_d8.text.content.disposer = local_110.text.content.disposer;
    local_d8.branches.ptr = local_110.branches.ptr;
    local_d8.branches.size_ = local_110.branches.size_;
    local_d8.branches.disposer = local_110.branches.disposer;
    local_110.branches.ptr = (Branch *)0x0;
    local_110.branches.size_ = 0;
    kj::StringTree::~StringTree(&local_110);
    kj::StringTree::StringTree(builder.pos,&local_d8);
    builder.pos = builder.pos + 1;
    kj::StringTree::~StringTree(&local_d8);
    pCVar2 = params->ptr;
  }
  local_128.size_ = ((long)builder.pos - (long)builder.ptr) / 0x38;
  local_128.ptr = builder.ptr;
  local_128.disposer = builder.disposer;
  builder.ptr = (StringTree *)0x0;
  builder.pos = (RemoveConst<kj::StringTree> *)0x0;
  builder.endPtr = (StringTree *)0x0;
  kj::ArrayBuilder<kj::StringTree>::dispose(&builder);
  delim.content.size_ = 3;
  delim.content.ptr = ", ";
  kj::StringTree::StringTree(&local_a0,&local_128,delim);
  local_110.size_._0_1_ = 0x3e;
  kj::strTree<kj::StringTree,char_const*,kj::StringPtr&,char,kj::StringTree,char>
            (&local_68,(kj *)this,(StringTree *)local_140,(char **)&innerName_local,
             (StringPtr *)&stack0xfffffffffffffe97,(char *)&local_a0,&local_110,
             (char *)CONCAT17(uVar3,in_stack_fffffffffffffe90));
  kj::StringTree::operator=(&this->name,&local_68);
  kj::StringTree::~StringTree(&local_68);
  kj::StringTree::~StringTree(&local_a0);
  kj::Array<kj::StringTree>::~Array(&local_128);
  return;
}

Assistant:

void addMemberTemplate(kj::StringPtr innerName, kj::Array<CppTypeName>&& params) {
    // Append "::innerName<params, ...>".
    //
    // If necessary, add the "template" disambiguation keyword in front of `innerName`.

    bool parentIsArgDependent = isArgDependent;
    needsTypename = parentIsArgDependent;
    hasDisambiguatedTemplate_ = hasDisambiguatedTemplate_ || parentIsArgDependent;

    name = kj::strTree(kj::mv(name),
        parentIsArgDependent ? "::template " : "::",
        innerName, '<',
        kj::StringTree(KJ_MAP(p, params) {
          if (p.isArgDependent) isArgDependent = true;
          if (p.hasInterfaces_) hasInterfaces_ = true;
          if (p.hasDisambiguatedTemplate_) hasDisambiguatedTemplate_ = true;
          return kj::strTree(kj::mv(p));
        }, ", "),
        '>');
  }